

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-sampling.cpp
# Opt level: O0

void __thiscall sampler_tester::sampler_tester(sampler_tester *this,size_t n_vocab)

{
  llama_token_data *plVar1;
  size_type sVar2;
  int in_ESI;
  undefined8 *in_RDI;
  float logit;
  llama_token token_id;
  vector<llama_token_data,_std::allocator<llama_token_data>_> *in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffc8;
  uint7 in_stack_ffffffffffffffc9;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_20;
  
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x1103e5);
  plVar1 = (llama_token_data *)(in_RDI + 7);
  std::vector<llama_token_data,_std::allocator<llama_token_data>_>::vector
            ((vector<llama_token_data,_std::allocator<llama_token_data>_> *)0x1103f8);
  std::vector<llama_token_data,_std::allocator<llama_token_data>_>::reserve
            ((vector<llama_token_data,_std::allocator<llama_token_data>_> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             CONCAT71(in_stack_ffffffffffffffc9,in_stack_ffffffffffffffc8));
  for (local_20 = 0; local_20 < in_ESI; local_20 = local_20 + 1) {
    logf((float)local_20);
    std::vector<llama_token_data,_std::allocator<llama_token_data>_>::emplace_back<llama_token_data>
              (in_stack_ffffffffffffffb0,plVar1);
  }
  plVar1 = std::vector<llama_token_data,_std::allocator<llama_token_data>_>::data
                     ((vector<llama_token_data,_std::allocator<llama_token_data>_> *)0x1104a0);
  sVar2 = std::vector<llama_token_data,_std::allocator<llama_token_data>_>::size
                    ((vector<llama_token_data,_std::allocator<llama_token_data>_> *)(in_RDI + 7));
  *in_RDI = plVar1;
  in_RDI[1] = sVar2;
  in_RDI[2] = 0xffffffffffffffff;
  in_RDI[3] = (ulong)in_stack_ffffffffffffffc9 << 8;
  return;
}

Assistant:

sampler_tester(size_t n_vocab) {
        cur.reserve(n_vocab);
        for (llama_token token_id = 0; token_id < (llama_token)n_vocab; token_id++) {
            const float logit = logf(token_id);
            cur.emplace_back(llama_token_data{token_id, logit, 0.0f});
        }

        cur_p = llama_token_data_array { cur.data(), cur.size(), -1, false };
    }